

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O3

void __thiscall
Fl_PostScript_Graphics_Driver::draw
          (Fl_PostScript_Graphics_Driver *this,Fl_Bitmap *bitmap,int XP,int YP,int WP,int HP,int cx,
          int cy)

{
  uchar *puVar1;
  int iVar2;
  undefined8 *data;
  void *pvVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  int local_54;
  ulong local_40;
  
  uVar5 = (ulong)(uint)WP;
  iVar4 = (bitmap->super_Fl_Image).w_;
  iVar6 = iVar4 + 0xe;
  if (-1 < iVar4 + 7) {
    iVar6 = iVar4 + 7;
  }
  if (iVar4 - cx < WP) {
    iVar2 = cx + 7;
    if (-1 < cx) {
      iVar2 = cx;
    }
    local_54 = (iVar6 >> 3) - (iVar2 >> 3);
    local_40 = (ulong)(uint)(iVar4 - cx);
  }
  else {
    iVar4 = WP + 0xe;
    if (-1 < WP + 7) {
      iVar4 = WP + 7;
    }
    iVar2 = cx + 7;
    if (-1 < cx) {
      iVar2 = cx;
    }
    local_54 = (iVar4 >> 3) - (iVar2 >> 3);
    local_40 = uVar5;
  }
  uVar8 = (bitmap->super_Fl_Image).h_ - cy;
  if (HP <= (int)uVar8) {
    uVar8 = HP;
  }
  uVar7 = cx + 7;
  if (-1 < cx) {
    uVar7 = cx;
  }
  puVar1 = bitmap->array;
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x2a])
            (this,(ulong)(uint)XP,(ulong)(uint)YP,uVar5,(ulong)(uint)HP);
  iVar4 = 0;
  fprintf((FILE *)this->output,"%i %i %i %i %i %i MI\n",(ulong)(((uVar7 & 0xfffffff8) - cx) + XP),
          (ulong)(uint)(YP + HP),uVar5,(ulong)(uint)-HP,local_40,(ulong)uVar8);
  data = (undefined8 *)operator_new(0x90);
  data[0x11] = 0;
  pvVar3 = operator_new(0x14);
  *(undefined8 *)((long)pvVar3 + 4) = 0;
  *data = pvVar3;
  if (0 < HP) {
    pbVar9 = puVar1 + ((iVar6 >> 3) * cy + ((int)uVar7 >> 3));
    do {
      iVar6 = local_54;
      if (0 < local_54) {
        do {
          write_rle85(this,""[*pbVar9 & 0xf] << 4 | ""[*pbVar9 >> 4],data);
          pbVar9 = pbVar9 + 1;
          iVar6 = iVar6 + -1;
        } while (iVar6 != 0);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != HP);
  }
  close_rle85(this,data);
  fputc(10,(FILE *)this->output);
  (*(this->super_Fl_Graphics_Driver).super_Fl_Device._vptr_Fl_Device[0x2e])(this);
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::draw(Fl_Bitmap * bitmap,int XP, int YP, int WP, int HP, int cx, int cy){
  const uchar  * di = bitmap->array;
  int w,h;
  int LD=(bitmap->w()+7)/8;
  int xx;

  if (WP> bitmap->w() - cx){// to assure that it does not go out of bounds;
     w = bitmap->w() - cx;
     xx = (bitmap->w()+7)/8 - cx/8; //length of mask in bytes
  }else{
    w =WP;
    xx = (w+7)/8 - cx/8;
  }
  if ( HP > bitmap->h()-cy)
    h = bitmap->h() - cy;
  else
    h = HP;

  di += cy*LD + cx/8;
  int si = cx % 8; // small shift to be clipped, it is simpler than shifting whole mask

  int i,j;
  push_clip(XP, YP, WP, HP);
  fprintf(output , "%i %i %i %i %i %i MI\n", XP - si, YP + HP , WP , -HP , w , h);

  void *rle85 = prepare_rle85();
  for (j=0; j<HP; j++){
    for (i=0; i<xx; i++){
      write_rle85(swap_byte(*di), rle85);
      di++;
    }
  }
  close_rle85(rle85); fputc('\n', output);
  pop_clip();
}